

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

void P_PlayerInSpecialSector(player_t *player,sector_t *sector)

{
  DAngle angle;
  double dVar1;
  bool bVar2;
  int iVar3;
  APlayerPawn *pAVar4;
  uint uVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar7;
  FName local_44;
  undefined8 local_40;
  DVector3 local_38;
  
  if (sector == (sector_t *)0x0) {
    pAVar4 = player->mo;
    sector = (pAVar4->super_AActor).Sector;
    dVar1 = sector_t::LowestFloorAt(sector,&pAVar4->super_AActor,(sector_t **)0x0);
    if ((1.52587890625e-05 <= ABS((pAVar4->super_AActor).__Pos.Z - dVar1)) &&
       ((player->mo->super_AActor).waterlevel == 0)) {
      return;
    }
  }
  iVar3 = sector->damageamount;
  if (iVar3 < 1) {
    if ((iVar3 < 0) && (level.time % (int)sector->damageinterval == 0)) {
      P_GiveBody(&player->mo->super_AActor,-iVar3,100);
    }
  }
  else {
    pAVar4 = player->mo;
    do {
      pAVar4 = (APlayerPawn *)
               GC::ReadBarrier<AInventory>((AInventory **)&(pAVar4->super_AActor).Inventory);
      uVar6 = extraout_XMM0_Da;
      uVar7 = extraout_XMM0_Db;
      if (pAVar4 == (APlayerPawn *)0x0) break;
      bVar2 = DObject::IsKindOf((DObject *)pAVar4,APowerIronFeet::RegistrationInfo.MyClass);
      uVar6 = extraout_XMM0_Da_00;
      uVar7 = extraout_XMM0_Db_00;
    } while (!bVar2);
    uVar5 = sector->Flags;
    if ((uVar5 >> 8 & 1) != 0) {
      *(byte *)&player->cheats = (byte)player->cheats & 0xfd;
    }
    if (pAVar4 != (APlayerPawn *)0x0) {
      iVar3 = FRandom::operator()(&pr_playerinspecialsector);
      if (sector->leakydamage <= iVar3) goto LAB_00450fdb;
      uVar5 = sector->Flags;
      uVar6 = extraout_XMM0_Da_01;
      uVar7 = extraout_XMM0_Db_01;
    }
    if ((uVar5 >> 10 & 1) == 0) {
      if (level.time % (int)sector->damageinterval == 0) {
        if ((player->cheats & 0x2000002U) == 0) {
          local_44.Index = (sector->damagetype).super_FName.Index;
          local_40 = 0;
          angle.Degrees._4_4_ = uVar7;
          angle.Degrees._0_4_ = uVar6;
          P_DamageMobj(&player->mo->super_AActor,(AActor *)0x0,(AActor *)0x0,sector->damageamount,
                       &local_44,0,angle);
          uVar5 = sector->Flags;
        }
        if ((((uVar5 >> 9 & 1) != 0) && (player->health < 0xb)) &&
           ((deathmatch.Value == 0 || ((dmflags.Value._1_1_ & 4) == 0)))) {
          G_ExitLevel(0,false);
          uVar5 = sector->Flags;
        }
        if ((char)uVar5 < '\0') {
          pAVar4 = player->mo;
          local_38.X = (pAVar4->super_AActor).__Pos.X;
          local_38.Y = (pAVar4->super_AActor).__Pos.Y;
          local_38.Z = (pAVar4->super_AActor).__Pos.Z;
          P_HitWater(&pAVar4->super_AActor,(pAVar4->super_AActor).Sector,&local_38,false,true,true);
        }
      }
    }
    else {
      player->hazardcount = player->hazardcount + sector->damageamount;
      (player->hazardtype).Index = (sector->damagetype).super_FName.Index;
      player->hazardinterval = (int)sector->damageinterval;
    }
  }
LAB_00450fdb:
  if ((int)sector->Flags < 0) {
    sector->Flags = sector->Flags & 0x7fffffff;
    P_GiveSecret(&player->mo->super_AActor,true,true,(int)(((long)sector - (long)sectors) / 0x218));
  }
  return;
}

Assistant:

void P_PlayerInSpecialSector (player_t *player, sector_t * sector)
{
	if (sector == NULL)
	{
		// Falling, not all the way down yet?
		sector = player->mo->Sector;
		if (!player->mo->isAtZ(sector->LowestFloorAt(player->mo))
			&& !player->mo->waterlevel)
		{
			return;
		}
	}

	// Has hit ground.
	AInventory *ironfeet;

	// [RH] Apply any customizable damage
	if (sector->damageamount > 0)
	{
		// Allow subclasses. Better would be to implement it as armor and let that reduce
		// the damage as part of the normal damage procedure. Unfortunately, I don't have
		// different damage types yet, so that's not happening for now.
		for (ironfeet = player->mo->Inventory; ironfeet != NULL; ironfeet = ironfeet->Inventory)
		{
			if (ironfeet->IsKindOf (RUNTIME_CLASS(APowerIronFeet)))
				break;
		}

		if (sector->Flags & SECF_ENDGODMODE) player->cheats &= ~CF_GODMODE;
		if ((ironfeet == NULL || pr_playerinspecialsector() < sector->leakydamage))
		{
			if (sector->Flags & SECF_HAZARD)
			{
				player->hazardcount += sector->damageamount;
				player->hazardtype = sector->damagetype;
				player->hazardinterval = sector->damageinterval;
			}
			else if (level.time % sector->damageinterval == 0)
			{
				if (!(player->cheats & (CF_GODMODE|CF_GODMODE2))) P_DamageMobj(player->mo, NULL, NULL, sector->damageamount, sector->damagetype);
				if ((sector->Flags & SECF_ENDLEVEL) && player->health <= 10 && (!deathmatch || !(dmflags & DF_NO_EXIT)))
				{
					G_ExitLevel(0, false);
				}
				if (sector->Flags & SECF_DMGTERRAINFX)
				{
					P_HitWater(player->mo, player->mo->Sector, player->mo->Pos(), false, true, true);
				}
			}
		}
	}
	else if (sector->damageamount < 0)
	{
		if (level.time % sector->damageinterval == 0)
		{
			P_GiveBody(player->mo, -sector->damageamount, 100);
		}
	}

	if (sector->isSecret())
	{
		sector->ClearSecret();
		P_GiveSecret(player->mo, true, true, int(sector - sectors));
	}
}